

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  double dVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  dVar6 = (double)(pFVar2->fadexpr_).left_.constant_;
  pFVar5 = (this->right_->fadexpr_).right_;
  return (((double)(pFVar1->fadexpr_).left_.constant_ + pFVar3->val_) - dVar6 * pFVar4->val_) *
         (pFVar5->dx_).ptr_to_data[i] +
         ((double)(this->right_->fadexpr_).left_.constant_ + pFVar5->val_) *
         ((pFVar3->dx_).ptr_to_data[i] - (pFVar4->dx_).ptr_to_data[i] * dVar6);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}